

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

void __thiscall
TempTracker<NumberTemp>::ProcessUse
          (TempTracker<NumberTemp> *this,StackSym *sym,BackwardPass *backwardPass)

{
  uint i;
  uint dstSymID_00;
  Instr *instr_00;
  bool bVar1;
  bool bVar2;
  RegOpnd *pRVar3;
  Opnd *pOVar4;
  SymOpnd *pSVar5;
  PropertySym *propertySym_00;
  char16 *pcVar6;
  BVSparse<Memory::JitArenaAllocator> **ppBVar7;
  char16_t *pcVar8;
  char16_t *pcVar9;
  bool local_59;
  BVSparse<Memory::JitArenaAllocator> **transferDependencies;
  PropertySym *propertySym;
  SymID dstSymID;
  Opnd *dstOpnd;
  bool isTempUse;
  bool isTempPropertyTransferStore;
  SymID usedSymID;
  Instr *instr;
  BackwardPass *backwardPass_local;
  StackSym *sym_local;
  TempTracker<NumberTemp> *this_local;
  
  bVar1 = StackSym::IsVar(sym);
  if (bVar1) {
    instr_00 = backwardPass->currentInstr;
    i = (sym->super_Sym).m_id;
    bVar1 = NumberTemp::IsTempPropertyTransferStore(&this->super_NumberTemp,instr_00,backwardPass);
    local_59 = true;
    if (!bVar1) {
      local_59 = NumberTemp::IsTempUse(instr_00,&sym->super_Sym,backwardPass);
    }
    if (local_59 == false) {
      BVSparse<Memory::JitArenaAllocator>::Set((BVSparse<Memory::JitArenaAllocator> *)this,i);
    }
    bVar2 = NumberTemp::DoTrace(backwardPass);
    if (bVar2) {
      pcVar6 = NumberTemp::GetTraceName();
      bVar2 = BackwardPass::IsPrePass(backwardPass);
      pcVar9 = L"";
      if (bVar2) {
        pcVar9 = L"Prepass ";
      }
      pcVar8 = L"Non ";
      if (local_59 != false) {
        pcVar8 = L"";
      }
      Output::Print(L"%s: %8s%4sTemp Use (s%-3d): ",pcVar6,pcVar9,pcVar8,(ulong)i);
      IR::Instr::DumpSimple(instr_00);
      Output::Flush();
    }
    bVar2 = NumberTemp::IsTempTransfer(instr_00);
    if ((bVar2) &&
       (BVSparse<Memory::JitArenaAllocator>::Set
                  (&(this->super_NumberTemp).super_TempTrackerBase.tempTransferredSyms,i),
       (this->super_NumberTemp).super_TempTrackerBase.tempTransferDependencies !=
       (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0)) {
      pOVar4 = IR::Instr::GetDst(instr_00);
      bVar2 = IR::Opnd::IsRegOpnd(pOVar4);
      if (bVar2) {
        pRVar3 = IR::Opnd::AsRegOpnd(pOVar4);
        dstSymID_00 = (pRVar3->m_sym->super_Sym).m_id;
        if (dstSymID_00 != i) {
          TempTrackerBase::AddTransferDependencies
                    ((TempTrackerBase *)this,i,dstSymID_00,
                     (this->super_NumberTemp).super_TempTrackerBase.tempTransferDependencies);
          bVar2 = NumberTemp::DoTrace(backwardPass);
          if (bVar2) {
            pcVar6 = NumberTemp::GetTraceName();
            bVar2 = BackwardPass::IsPrePass(backwardPass);
            pcVar9 = L"";
            if (bVar2) {
              pcVar9 = L"Prepass ";
            }
            Output::Print(L"%s: %8s s%d -> s%d: ",pcVar6,pcVar9,(ulong)dstSymID_00,(ulong)i);
            ppBVar7 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Get
                                ((this->super_NumberTemp).super_TempTrackerBase.
                                 tempTransferDependencies,i);
            BVSparse<Memory::JitArenaAllocator>::Dump(*ppBVar7);
          }
        }
      }
    }
    if (bVar1) {
      BVSparse<Memory::JitArenaAllocator>::Set
                (&(this->super_NumberTemp).super_TempTrackerBase.tempTransferredSyms,i);
      pOVar4 = IR::Instr::GetDst(instr_00);
      pSVar5 = IR::Opnd::AsSymOpnd(pOVar4);
      propertySym_00 = Sym::AsPropertySym(pSVar5->m_sym);
      NumberTemp::PropagateTempPropertyTransferStoreDependencies
                (&this->super_NumberTemp,i,propertySym_00,backwardPass);
      bVar1 = NumberTemp::DoTrace(backwardPass);
      if ((bVar1) &&
         ((this->super_NumberTemp).super_TempTrackerBase.tempTransferDependencies !=
          (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0)) {
        pcVar6 = NumberTemp::GetTraceName();
        bVar1 = BackwardPass::IsPrePass(backwardPass);
        pcVar9 = L"";
        if (bVar1) {
          pcVar9 = L"Prepass ";
        }
        Output::Print(L"%s: %8s (PropId:%d)+[] -> s%d: ",pcVar6,pcVar9,
                      (ulong)(uint)propertySym_00->m_propertyId,(ulong)i);
        ppBVar7 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Get
                            ((this->super_NumberTemp).super_TempTrackerBase.tempTransferDependencies
                             ,i);
        if (ppBVar7 == (BVSparse<Memory::JitArenaAllocator> **)0x0) {
          Output::Print(L"[]\n");
        }
        else {
          BVSparse<Memory::JitArenaAllocator>::Dump(*ppBVar7);
        }
      }
    }
  }
  return;
}

Assistant:

void
TempTracker<T>::ProcessUse(StackSym * sym, BackwardPass * backwardPass)
{
    // Don't care about type specialized syms
    if (!sym->IsVar())
    {
        return;
    }
    IR::Instr * instr = backwardPass->currentInstr;
    SymID usedSymID = sym->m_id;
    bool isTempPropertyTransferStore = T::IsTempPropertyTransferStore(instr, backwardPass);
    bool isTempUse = isTempPropertyTransferStore || T::IsTempUse(instr, sym, backwardPass);
    if (!isTempUse)
    {
        this->nonTempSyms.Set(usedSymID);
    }
#if DBG
    if (T::DoTrace(backwardPass))
    {
        Output::Print(_u("%s: %8s%4sTemp Use (s%-3d): "), T::GetTraceName(),
            backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), isTempUse ? _u("") : _u("Non "), usedSymID);
        instr->DumpSimple();
        Output::Flush();
    }
#endif
    if (T::IsTempTransfer(instr))
    {
        this->tempTransferredSyms.Set(usedSymID);

        // Track dependencies if we are in loop only
        if (this->tempTransferDependencies != nullptr)
        {
            IR::Opnd * dstOpnd = instr->GetDst();
            if (dstOpnd->IsRegOpnd())
            {
                SymID dstSymID = dstOpnd->AsRegOpnd()->m_sym->m_id;

                if (dstSymID != usedSymID)
                {
                    // Record that the usedSymID may propagate to dstSymID and all the symbols
                    // that it may propagate to as well
                    this->AddTransferDependencies(usedSymID, dstSymID, this->tempTransferDependencies);
#if DBG_DUMP
                    if (T::DoTrace(backwardPass))
                    {
                        Output::Print(_u("%s: %8s s%d -> s%d: "), T::GetTraceName(),
                            backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), dstSymID, usedSymID);
                        (*this->tempTransferDependencies->Get(usedSymID))->Dump();
                    }
#endif
                }
            }
        }
    }

    if (isTempPropertyTransferStore)
    {
        this->tempTransferredSyms.Set(usedSymID);
        PropertySym * propertySym = instr->GetDst()->AsSymOpnd()->m_sym->AsPropertySym();
        this->PropagateTempPropertyTransferStoreDependencies(usedSymID, propertySym, backwardPass);

#if DBG_DUMP
        if (T::DoTrace(backwardPass) && this->tempTransferDependencies)
        {
            Output::Print(_u("%s: %8s (PropId:%d)+[] -> s%d: "), T::GetTraceName(),
                backwardPass->IsPrePass() ? _u("Prepass ") : _u(""), propertySym->m_propertyId, usedSymID);
            BVSparse<JitArenaAllocator> ** transferDependencies = this->tempTransferDependencies->Get(usedSymID);
            if (transferDependencies)
            {
                (*transferDependencies)->Dump();
            }
            else
            {
                Output::Print(_u("[]\n"));
            }
        }
#endif
    }
}